

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_already_open(fitsfile **fptr,char *url,char *urltype,char *infile,char *extspec,
                     char *rowfilter,char *binspec,char *colspec,int mode,int noextsyn,int *isopen,
                     int *status)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  char *in_RCX;
  char *in_RDX;
  long *in_RDI;
  char *in_R8;
  char *in_R9;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int in_stack_00000018;
  char tmpinfile [1025];
  char tmpStr [1025];
  char cwd [1025];
  char oldcolspec [1025];
  char oldbinspec [1025];
  char oldrowfilter [1025];
  char oldoutfile [1025];
  char oldextspec [1025];
  char oldinfile [1025];
  char oldurltype [20];
  int iMatch;
  int ii;
  FITSfile *oldFptr;
  char *in_stack_ffffffffffffdaf0;
  char *in_stack_ffffffffffffdaf8;
  char local_24f8 [8];
  char *in_stack_ffffffffffffdb10;
  char *in_stack_ffffffffffffdb18;
  char *in_stack_ffffffffffffdb20;
  char *in_stack_ffffffffffffdb28;
  char *in_stack_ffffffffffffdb30;
  char *in_stack_ffffffffffffdb38;
  char *in_stack_ffffffffffffdb50;
  char *in_stack_ffffffffffffdb58;
  int *in_stack_ffffffffffffdb60;
  int *in_stack_ffffffffffffe310;
  char *in_stack_ffffffffffffe318;
  char local_18c8 [1040];
  char local_14b8 [1040];
  char local_10a8 [2080];
  char local_888 [1040];
  char local_478 [1040];
  char local_68 [32];
  int local_48;
  int local_44;
  FITSfile *local_40;
  char *local_38;
  char *local_30;
  char *local_20;
  long *local_10;
  int local_4;
  
  local_48 = -1;
  *(undefined4 *)tmpinfile._8_8_ = 0;
  if (in_stack_00000018 == 0) {
    local_4 = *(int *)tmpinfile._16_8_;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_20 = in_RDX;
    local_10 = in_RDI;
    strcpy(local_24f8,in_RCX);
    iVar1 = fits_strcasecmp(in_stack_ffffffffffffdaf8,in_stack_ffffffffffffdaf0);
    if ((iVar1 == 0) &&
       (iVar1 = standardize_path(in_stack_ffffffffffffe318,in_stack_ffffffffffffe310), iVar1 != 0))
    {
      local_4 = *(int *)tmpinfile._16_8_;
    }
    else {
      for (local_44 = 0; local_44 < 10000; local_44 = local_44 + 1) {
        if (FptrTable[local_44] != (FITSfile *)0x0) {
          local_40 = FptrTable[local_44];
          if (local_40->noextsyntax == 0) {
            in_stack_ffffffffffffdaf0 = local_18c8;
            in_stack_ffffffffffffdaf8 = (char *)tmpinfile._16_8_;
            ffiurl(in_stack_ffffffffffffdb38,in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb28,
                   in_stack_ffffffffffffdb20,in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb10,
                   in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb60);
            if (0 < *(int *)tmpinfile._16_8_) {
              ffpmsg((char *)0x1124ae);
              ffpmsg((char *)0x1124bf);
              return *(int *)tmpinfile._16_8_;
            }
            iVar1 = fits_strcasecmp(in_stack_ffffffffffffdaf8,in_stack_ffffffffffffdaf0);
            if ((iVar1 == 0) &&
               (iVar1 = standardize_path(in_stack_ffffffffffffe318,in_stack_ffffffffffffe310),
               iVar1 != 0)) {
              return *(int *)tmpinfile._16_8_;
            }
            iVar1 = strcmp(local_20,local_68);
            if (((iVar1 == 0) && (iVar1 = strcmp(local_24f8,local_478), iVar1 == 0)) &&
               ((((*local_38 == '\0' &&
                  (((local_10a8[0] == '\0' && (*in_stack_00000008 == '\0')) &&
                   (local_14b8[0] == '\0')))) &&
                 ((*in_stack_00000010 == '\0' && (local_18c8[0] == '\0')))) ||
                ((iVar1 = strcmp(local_38,local_10a8), iVar1 == 0 &&
                 (((iVar1 = strcmp(in_stack_00000008,local_14b8), iVar1 == 0 &&
                   (iVar1 = strcmp(in_stack_00000010,local_18c8), iVar1 == 0)) &&
                  (iVar1 = strcmp(local_30,local_888), iVar1 == 0)))))))) {
              if ((in_stack_00000018 == 1) && (local_40->writemode == 0)) {
                ffpmsg((char *)0x112632);
                ffpmsg((char *)0x11263f);
                *(undefined4 *)tmpinfile._16_8_ = 0x68;
                return 0x68;
              }
              local_48 = local_44;
            }
          }
          else {
            iVar1 = fits_strcasecmp(in_stack_ffffffffffffdaf8,in_stack_ffffffffffffdaf0);
            if (iVar1 == 0) {
              sVar2 = strlen(local_40->filename);
              if (0x400 < sVar2) {
                ffpmsg((char *)0x11231d);
                *(undefined4 *)tmpinfile._16_8_ = 0x68;
                return 0x68;
              }
              strcpy(local_478,local_40->filename);
              iVar1 = standardize_path(in_stack_ffffffffffffe318,in_stack_ffffffffffffe310);
              if (iVar1 != 0) {
                return *(int *)tmpinfile._16_8_;
              }
              iVar1 = strcmp(local_24f8,local_478);
              if ((iVar1 == 0) &&
                 ((tmpinfile._0_4_ != 0 ||
                  (((*local_38 == '\0' && (*in_stack_00000008 == '\0')) &&
                   (*in_stack_00000010 == '\0')))))) {
                if ((in_stack_00000018 == 1) && (local_40->writemode == 0)) {
                  ffpmsg((char *)0x1123f4);
                  ffpmsg((char *)0x112401);
                  *(undefined4 *)tmpinfile._16_8_ = 0x68;
                  return 0x68;
                }
                local_48 = local_44;
              }
            }
          }
        }
      }
      if (-1 < local_48) {
        local_40 = FptrTable[local_48];
        pvVar3 = calloc(1,0x10);
        *local_10 = (long)pvVar3;
        if (*local_10 == 0) {
          ffpmsg((char *)0x1126e9);
          ffpmsg((char *)0x1126f6);
          *(undefined4 *)tmpinfile._16_8_ = 0x71;
          return 0x71;
        }
        *(FITSfile **)(*local_10 + 8) = local_40;
        *(undefined4 *)*local_10 = 0;
        *(int *)(*(long *)(*local_10 + 8) + 8) = *(int *)(*(long *)(*local_10 + 8) + 8) + 1;
        if (*in_stack_00000008 != '\0') {
          *local_30 = '\0';
        }
        *local_38 = '\0';
        *in_stack_00000008 = '\0';
        *in_stack_00000010 = '\0';
        *(undefined4 *)tmpinfile._8_8_ = 1;
      }
      local_4 = *(int *)tmpinfile._16_8_;
    }
  }
  return local_4;
}

Assistant:

int fits_already_open(fitsfile **fptr, /* I/O - FITS file pointer       */ 
           char *url, 
           char *urltype, 
           char *infile, 
           char *extspec, 
           char *rowfilter,
           char *binspec, 
           char *colspec, 
           int  mode,             /* I - 0 = open readonly; 1 = read/write   */
           int  noextsyn, /* I - 0 = ext syntax may be used; 1 = ext syntax disabled */
           int  *isopen,          /* O - 1 = file is already open            */
           int  *status)          /* IO - error status                       */
/*
  Check if the file to be opened is already open.  If so, then attach to it.
*/

   /* the input strings must not exceed the standard lengths */
   /* of FLEN_FILENAME, MAX_PREFIX_LEN, etc. */

     /*
       this function was changed so that for files of access method FILE://
       the file paths are compared using standard URL syntax and absolute
       paths (as opposed to relative paths). This eliminates some instances
       where a file is already opened but it is not realized because it
       was opened with another file path. For instance, if the CWD is
       /a/b/c and I open /a/b/c/foo.fits then open ./foo.fits the previous
       version of this function would not have reconized that the two files
       were the same. This version does recognize that the two files are
       the same.
     */
{
    FITSfile *oldFptr;
    int ii, iMatch=-1;
    char oldurltype[MAX_PREFIX_LEN], oldinfile[FLEN_FILENAME];
    char oldextspec[FLEN_FILENAME], oldoutfile[FLEN_FILENAME];
    char oldrowfilter[FLEN_FILENAME];
    char oldbinspec[FLEN_FILENAME], oldcolspec[FLEN_FILENAME];
    char cwd[FLEN_FILENAME];
    char tmpStr[FLEN_FILENAME];
    char tmpinfile[FLEN_FILENAME]; 
    
    *isopen = 0;

/*  When opening a file with readonly access then we simply let
    the operating system open the file again, instead of using the CFITSIO
    trick of attaching to the previously opened file.  This is required
    if CFITSIO is running in a multi-threaded environment, because 2 different
    threads cannot share the same FITSfile pointer.
    
    If the file is opened/reopened with write access, then the file MUST
    only be physically opened once..
*/ 
    if (mode == 0)
        return(*status);

    strcpy(tmpinfile, infile);
    if(fits_strcasecmp(urltype,"FILE://") == 0)
    {
       if (standardize_path(tmpinfile, status))
          return(*status);          
    }

    for (ii = 0; ii < NMAXFILES; ii++)   /* check every buffer */
    {
        if (FptrTable[ii] != 0)
        {
          oldFptr = FptrTable[ii];
          
          if (oldFptr->noextsyntax)
          {
            /* old urltype must be "file://" */
            if (fits_strcasecmp(urltype,"FILE://") == 0)
            {
               /* compare tmpinfile to adjusted oldFptr->filename */
               
               /* This shouldn't be possible, but check anyway */
               if (strlen(oldFptr->filename) > FLEN_FILENAME-1)        
               {
                  ffpmsg("Name of old file is too long. (fits_already_open)");
                  return (*status = FILE_NOT_OPENED);
               }
               strcpy(oldinfile, oldFptr->filename);
               if (standardize_path(oldinfile, status))
                  return(*status);
                              
               if (!strcmp(tmpinfile, oldinfile))
               {
                  /* if infile is not noextsyn, must check that it is not
                     using filters of any kind */
                  if (noextsyn || (!rowfilter[0] && !binspec[0] && !colspec[0])) 
                  {
                     if (mode == READWRITE && oldFptr->writemode == READONLY)
                     {
                       /*
                         cannot assume that a file previously opened with READONLY
                         can now be written to (e.g., files on CDROM, or over the
                         the network, or STDIN), so return with an error.
                       */

                       ffpmsg(
                   "cannot reopen file READWRITE when previously opened READONLY");
                       ffpmsg(url);
                       return(*status = FILE_NOT_OPENED);
                     }
                     iMatch = ii;
                  }  
               }
             }            
          } /* end if old file has disabled extended syntax */
          else
          {
             fits_parse_input_url(oldFptr->filename, oldurltype, 
                       oldinfile, oldoutfile, oldextspec, oldrowfilter, 
                       oldbinspec, oldcolspec, status);

             if (*status > 0)
             {
               ffpmsg("could not parse the previously opened filename: (ffopen)");
               ffpmsg(oldFptr->filename);
               return(*status);
             }
             
             if(fits_strcasecmp(oldurltype,"FILE://") == 0)
               {
                 if (standardize_path(oldinfile, status))
                    return(*status);
               }

             if (!strcmp(urltype, oldurltype) && !strcmp(tmpinfile, oldinfile) )
             {
                 /* identical type of file and root file name */

                 if ( (!rowfilter[0] && !oldrowfilter[0] &&
                       !binspec[0]   && !oldbinspec[0] &&
                       !colspec[0]   && !oldcolspec[0])

                     /* no filtering or binning specs for either file, so */
                     /* this is a case where the same file is being reopened. */
                     /* It doesn't matter if the extensions are different */

                         ||   /* or */

                     (!strcmp(rowfilter, oldrowfilter) &&
                      !strcmp(binspec, oldbinspec)     &&
                      !strcmp(colspec, oldcolspec)     &&
                      !strcmp(extspec, oldextspec) ) )

                     /* filtering specs are given and are identical, and */
                     /* the same extension is specified */

                 {
                     if (mode == READWRITE && oldFptr->writemode == READONLY)
                     {
                       /*
                         cannot assume that a file previously opened with READONLY
                         can now be written to (e.g., files on CDROM, or over the
                         the network, or STDIN), so return with an error.
                       */

                       ffpmsg(
                   "cannot reopen file READWRITE when previously opened READONLY");
                       ffpmsg(url);
                       return(*status = FILE_NOT_OPENED);
                     }
                     iMatch = ii;

                  }
              }
          } /* end if old file recognizes extended syntax */
      } /* end if old fptr exists */
    } /* end loop over NMAXFILES */
    if (iMatch >= 0)
    {
       oldFptr = FptrTable[iMatch];
       *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

       if (!(*fptr))
       {
          ffpmsg(
        "failed to allocate structure for following file: (ffopen)");
          ffpmsg(url);
          return(*status = MEMORY_ALLOCATION);
       }

       (*fptr)->Fptr = oldFptr; /* point to the structure */
       (*fptr)->HDUposition = 0;     /* set initial position */
       (((*fptr)->Fptr)->open_count)++;  /* increment usage counter */

       if (binspec[0])  /* if binning specified, don't move */
           extspec[0] = '\0';

       /* all the filtering has already been applied, so ignore */
       rowfilter[0] = '\0';
       binspec[0] = '\0';
       colspec[0] = '\0';

       *isopen = 1;
    }
    return(*status);
}